

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

StringOrCallback * __thiscall
google::protobuf::io::Printer::ValueImpl<true>::
ToStringOrCallback<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::GenerateKotlinDslMembers(google::protobuf::io::Printer*)const::__4,void>
          (variant<std::__cxx11::string,std::function<bool()>> *__return_storage_ptr__,
          ValueImpl<true> *this,undefined8 *cb)

{
  anon_class_16_2_40fd6f3e local_58;
  function<bool_()> local_48;
  undefined8 *local_28;
  anon_class_8_1_55a613f1_for_cb *cb_local;
  ValueImpl<true> *this_local;
  variant<std::__cxx11::string,std::function<bool()>> *local_10;
  
  local_58.cb.name_ctx = (JvmNameContext *)*cb;
  local_58.is_called = false;
  local_28 = cb;
  cb_local = (anon_class_8_1_55a613f1_for_cb *)this;
  local_10 = __return_storage_ptr__;
  std::function<bool()>::
  function<google::protobuf::io::Printer::ValueImpl<true>::ToStringOrCallback<google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::GenerateKotlinDslMembers(google::protobuf::io::Printer*)const::__4,void>(google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::GenerateKotlinDslMembers(google::protobuf::io::Printer*)const::__4&&,google::protobuf::io::Printer::ValueImpl<true>::Rank2)::_lambda()_1_,void>
            ((function<bool()> *)&local_48,&local_58);
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (__return_storage_ptr__,&local_48);
  std::function<bool_()>::~function(&local_48);
  return (StringOrCallback *)__return_storage_ptr__;
}

Assistant:

auto Printer::ValueImpl<owned>::ToStringOrCallback(Cb&& cb, Rank2)
    -> StringOrCallback {
  return Callback(
      [cb = std::forward<Cb>(cb), is_called = false]() mutable -> bool {
        if (is_called) {
          // Catch whether or not this function is being called recursively.
          return false;
        }
        is_called = true;
        cb();
        is_called = false;
        return true;
      });
}